

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int safe_var_substitution_p(gen_ctx_t gen_ctx,MIR_reg_t var,bb_insn_t_conflict bb_insn)

{
  combine_ctx *pcVar1;
  dead_var_t_conflict pdVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  DLIST_dead_var_t *pDVar6;
  
  uVar4 = 0;
  if (var != 0xffffffff) {
    uVar5 = (ulong)var;
    sVar3 = VARR_size_tlength(gen_ctx->combine_ctx->var_ref_ages);
    if (((uVar5 < sVar3) &&
        (pcVar1 = gen_ctx->combine_ctx,
        pcVar1->var_ref_ages_addr[uVar5] == pcVar1->curr_bb_var_ref_age)) &&
       (uVar4 = 0, pcVar1->var_refs_addr[uVar5].def_p != '\0')) {
      pDVar6 = &bb_insn->insn_dead_vars;
      do {
        pdVar2 = pDVar6->head;
        if (pdVar2 == (dead_var_t_conflict)0x0) break;
        pDVar6 = (DLIST_dead_var_t *)&(pdVar2->dead_var_link).next;
      } while (pdVar2->var != var);
      uVar4 = (uint)(pdVar2 != (dead_var_t_conflict)0x0);
    }
  }
  return uVar4;
}

Assistant:

static int safe_var_substitution_p (gen_ctx_t gen_ctx, MIR_reg_t var, bb_insn_t bb_insn) {
  return (var != MIR_NON_VAR && var < VARR_LENGTH (size_t, var_ref_ages)
          && var_ref_ages_addr[var] == curr_bb_var_ref_age
          && var_refs_addr[var].def_p
          /* It is not safe to substitute if there is another use after def insn before
             the current insn as we delete def insn after the substitution. */
          && find_bb_insn_dead_var (bb_insn, var) != NULL);
}